

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

void tree_print_snode(lyout *out,int level,uint16_t max_name_len,lys_node *node,int mask,
                     lys_node *aug_parent,int subtree,tp_opts *opts)

{
  long lVar1;
  lys_ext_instance *plVar2;
  lys_ext_instance **pplVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  uint16_t max_name_len_00;
  LYS_NODE LVar7;
  int iVar8;
  int iVar9;
  lys_node *plVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  byte bVar16;
  LYS_NODE LVar17;
  lys_iffeature *iff2;
  uint8_t iff1_size;
  uint uVar18;
  char *pcVar19;
  lys_iffeature *iff1;
  ly_ctx *plVar20;
  uint8_t iff2_size;
  int iVar21;
  lys_module **pplVar22;
  bool bVar23;
  lys_module *local_50;
  lys_module *local_48;
  char *text_str;
  int local_38;
  LYS_NODE local_34;
  
  uVar18 = 0;
  if (node->parent != (lys_node *)0x0) {
    uVar18 = (uint)(node->parent->nodetype == LYS_AUGMENT);
  }
  plVar10 = lys_is_disabled(node,uVar18);
  if (plVar10 != (lys_node *)0x0) {
    return;
  }
  LVar17 = node->nodetype;
  if ((LVar17 & mask) == LYS_UNKNOWN) {
    return;
  }
  if (((LVar17 & mask & (LYS_OUTPUT|LYS_INPUT|LYS_CASE)) != LYS_UNKNOWN) &&
     ((node->flags & 0x40) != 0)) {
    if (LVar17 != LYS_CASE) {
      return;
    }
    plVar10 = lys_is_disabled(node->child,0);
    if (plVar10 != (lys_node *)0x0) {
      return;
    }
    LVar17 = node->nodetype;
  }
  LVar7 = LVar17 & mask;
  local_34 = mask;
  if (LVar7 == LYS_ANYXML) {
    plVar10 = lys_parent(node);
    if ((plVar10 == (lys_node *)0x0) &&
       ((iVar8 = strcmp(node->name,"config"), iVar8 == 0 &&
        (iVar8 = strcmp(node->module->name,"ietf-netconf"), iVar8 == 0)))) {
      return;
    }
LAB_00195beb:
    text_str = (char *)CONCAT44(text_str._4_4_,level);
    iVar8 = tree_print_indent(out,level,opts);
    pcVar19 = "o";
    if ((node->flags & 0x20) == 0) {
      pcVar19 = "+";
    }
    pcVar14 = "x";
    if ((node->flags & 0x10) == 0) {
      pcVar14 = pcVar19;
    }
    local_38 = ly_print(out,"%s--",pcVar14);
    LVar17 = node->nodetype;
    local_50 = (lys_module *)CONCAT44(local_50._4_4_,iVar8);
    if ((int)LVar17 < 0x100) {
      if (LVar17 == LYS_CASE) {
        pcVar19 = ":(";
        goto LAB_00195c90;
      }
      if (LVar17 == LYS_NOTIF) {
        pcVar19 = "-n ";
        goto LAB_00195c90;
      }
LAB_00195d77:
      if (opts->spec_config == 2) {
        pcVar19 = "ro ";
LAB_00196190:
        iVar9 = ly_print(out,pcVar19);
      }
      else {
        if (opts->spec_config == 1) {
          pcVar19 = "-w ";
          goto LAB_00196190;
        }
        pcVar19 = "ro";
        if ((node->flags & 2) == 0) {
          pcVar19 = "--";
        }
        pcVar14 = "rw";
        if ((node->flags & 1) == 0) {
          pcVar14 = pcVar19;
        }
        iVar9 = ly_print(out,"%s ",pcVar14);
      }
      if (node->nodetype == LYS_CHOICE) {
        iVar21 = ly_print(out,"(");
        iVar9 = iVar9 + iVar21;
      }
    }
    else {
      if (LVar17 != LYS_ACTION) {
        if (LVar17 == LYS_USES) {
          pcVar19 = "-u ";
          goto LAB_00195c90;
        }
        if (LVar17 != LYS_RPC) goto LAB_00195d77;
      }
      pcVar19 = "-x ";
LAB_00195c90:
      iVar9 = ly_print(out,pcVar19);
    }
    plVar11 = lys_node_module(node);
    plVar12 = lys_main_module(opts->module);
    if (plVar12 == plVar11) {
      uVar18 = 0;
    }
    else {
      uVar18 = ly_print(out,"%s:",
                        *(undefined8 *)(plVar11->padding2 + (ulong)(opts->options & 1) * 8 + -0x3a))
      ;
      uVar18 = uVar18 & 0xffff;
    }
    local_38 = local_38 + iVar8;
    iVar8 = ly_print(out,node->name);
    mask = local_34;
    iVar8 = iVar8 + uVar18;
    LVar17 = node->nodetype & local_34;
    pcVar19 = "*";
    if ((int)LVar17 < 0x10) {
      switch(LVar17) {
      case LYS_CONTAINER:
        lVar1._0_2_ = node[1].flags;
        lVar1._2_1_ = node[1].ext_size;
        lVar1._3_1_ = node[1].iffeature_size;
        lVar1._4_1_ = node[1].padding[0];
        lVar1._5_1_ = node[1].padding[1];
        lVar1._6_1_ = node[1].padding[2];
        lVar1._7_1_ = node[1].padding[3];
        if (lVar1 != 0) {
          pcVar19 = "!";
          goto switchD_00195d2a_caseD_8;
        }
        break;
      case LYS_CHOICE:
        iVar21 = ly_print(out,")");
        iVar8 = iVar8 + iVar21;
        bVar4 = (byte)node->flags;
joined_r0x00195d73:
        if ((bVar4 & 0x40) == 0) {
LAB_00195dcb:
          pcVar19 = "?";
          goto switchD_00195d2a_caseD_8;
        }
        break;
      case LYS_LEAF:
        if (((node->flags & 0x40) == 0) && (iVar21 = tree_leaf_is_mandatory(node), iVar21 == 0))
        goto LAB_00195dcb;
        break;
      case LYS_LEAFLIST:
switchD_00195d2a_caseD_8:
        iVar21 = ly_print(out,pcVar19);
        iVar8 = iVar8 + iVar21;
      }
    }
    else if ((int)LVar17 < 0x40) {
      if (LVar17 == LYS_LIST) goto switchD_00195d2a_caseD_8;
      if (LVar17 == LYS_ANYXML) {
LAB_00195d6e:
        bVar4 = (byte)node->flags;
        goto joined_r0x00195d73;
      }
    }
    else {
      if (LVar17 == LYS_CASE) {
        pcVar19 = ")";
        goto switchD_00195d2a_caseD_8;
      }
      if (LVar17 == LYS_ANYDATA) goto LAB_00195d6e;
    }
    local_38 = local_38 + iVar9;
    if (subtree == 0) {
      if ((int)text_str < 0x40) {
        bVar16 = (byte)text_str;
        bVar4 = bVar16 & 0x3f;
        opts->indent = opts->indent & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        if (node->nodetype == LYS_CASE) {
          bVar23 = false;
        }
        else {
          plVar10 = lys_parent(node);
          if ((((plVar10 == (lys_node *)0x0) ||
               (plVar10 = lys_parent(node),
               (plVar10->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN)) ||
              (node->next == (lys_node *)0x0)) ||
             (plVar10 = lys_parent(node->next), plVar10 == (lys_node *)0x0)) {
            bVar23 = false;
          }
          else {
            plVar10 = lys_parent(node->next);
            bVar23 = plVar10->nodetype == LYS_CHOICE;
          }
        }
        iVar9 = tree_sibling_is_valid_child(node,0,opts->module,aug_parent,node->nodetype);
        mask = local_34;
        if ((!bVar23) && (iVar9 != 0)) {
          opts->indent = opts->indent | 1L << (bVar16 & 0x3f);
        }
      }
      else {
        ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
               ,0x9d);
      }
    }
    iVar21 = local_38 + iVar8;
    iVar9 = (int)text_str + 1;
    text_str = (char *)CONCAT44(text_str._4_4_,iVar9);
    LVar17 = node->nodetype & mask;
    cVar6 = (char)iVar8;
    cVar5 = (char)max_name_len;
    if ((int)LVar17 < 0x10) {
      if ((LVar17 == LYS_LEAF) || (LVar17 == LYS_LEAFLIST)) {
        if (max_name_len == 0) {
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x25c,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        uVar18 = opts->options;
        plVar11 = (lys_module *)node[1].iffeature[1].features;
        if ((*(int *)&node[1].ref == 9) && (node[1].ext[6] == (lys_ext_instance *)0x0)) {
          if ((uVar18 & 8) == 0) {
            plVar12 = node[1].module;
            if ((uVar18 & 1) == 0) {
              local_38 = iVar21;
              sVar15 = strlen((char *)plVar12);
              pcVar14 = (char *)malloc((long)((sVar15 << 0x20) + 0x400000000) >> 0x20);
              if (pcVar14 != (char *)0x0) {
                sVar15 = (size_t)((int)sVar15 + 3);
                sprintf(pcVar14,"-> %s",plVar12);
                plVar20 = plVar11->ctx;
                goto LAB_00196275;
              }
            }
            else {
              local_38 = iVar21;
              pcVar19 = transform_json2schema(plVar11,(char *)plVar12);
              sVar15 = strlen(pcVar19);
              pcVar14 = (char *)malloc((long)((sVar15 << 0x20) + 0x400000000) >> 0x20);
              if (pcVar14 != (char *)0x0) {
                sVar15 = (size_t)((int)sVar15 + 3);
                sprintf(pcVar14,"-> %s",pcVar19);
                local_50 = (lys_module *)lydict_insert_zc(plVar11->ctx,pcVar14);
                local_48 = local_50;
                lydict_remove(plVar11->ctx,pcVar19);
                mask = local_34;
                iVar21 = local_38;
                goto LAB_00196353;
              }
            }
LAB_00196325:
            plVar20 = plVar11->ctx;
LAB_00196329:
            sVar15 = 0;
            ly_log(plVar20,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","tree_print_type");
            mask = local_34;
            iVar21 = local_38;
          }
          else {
            local_50 = (lys_module *)lydict_insert(plVar11->ctx,"leafref",7);
            sVar15 = 7;
            local_48 = local_50;
          }
        }
        else {
          iVar8 = lys_type_is_local((lys_type *)&node[1].ref);
          if (iVar8 == 0) {
            pplVar3 = node[1].ext;
            pcVar19 = (char *)pplVar3[6]->parent;
            local_50 = plVar11;
            if ((uVar18 & 1) == 0) {
              local_38 = iVar21;
              sVar15 = strlen(pcVar19);
              plVar2 = *pplVar3;
              sVar13 = strlen((char *)plVar2);
              sVar15 = sVar15 + sVar13 + 1;
              pcVar14 = (char *)malloc((long)((sVar15 << 0x20) + 0x100000000) >> 0x20);
              if (pcVar14 == (char *)0x0) {
                plVar20 = plVar11->ctx;
                goto LAB_00196329;
              }
              sprintf(pcVar14,"%s:%s",pcVar19,plVar2);
              plVar20 = plVar11->ctx;
            }
            else {
              local_38 = iVar21;
              pcVar19 = transform_module_name2import_prefix(plVar11,pcVar19);
              sVar15 = strlen(pcVar19);
              plVar2 = *node[1].ext;
              sVar13 = strlen((char *)plVar2);
              sVar15 = sVar15 + sVar13 + 1;
              pcVar14 = (char *)malloc((long)((sVar15 << 0x20) + 0x100000000) >> 0x20);
              if (pcVar14 == (char *)0x0) goto LAB_00196325;
              sprintf(pcVar14,"%s:%s",pcVar19,plVar2);
              plVar20 = plVar11->ctx;
            }
LAB_00196275:
            local_50 = (lys_module *)lydict_insert_zc(plVar20,pcVar14);
            mask = local_34;
            iVar21 = local_38;
            local_48 = local_50;
          }
          else {
            plVar2 = *node[1].ext;
            sVar15 = strlen((char *)plVar2);
            local_50 = (lys_module *)lydict_insert(plVar11->ctx,(char *)plVar2,(long)(int)sVar15);
            mask = local_34;
            local_48 = local_50;
          }
        }
LAB_00196353:
        iVar8 = tree_print_wrap(out,(int)text_str,iVar21,(cVar5 - cVar6) + '\x03',
                                (ushort)sVar15 & 0xff,opts);
        iVar21 = ly_print(out,(char *)local_50);
        iVar21 = iVar21 + iVar8;
        lydict_remove(opts->module->ctx,(char *)local_50);
      }
    }
    else if (LVar17 == LYS_LIST) {
      iVar8 = tree_print_keys(out,*(lys_node_leaf ***)&node[1].flags,node->padding[2],opts,
                              (char **)&local_48);
      if ((char)iVar8 != '\0') {
        iVar8 = tree_print_wrap(out,(int)text_str,iVar21,'\x01',(ushort)iVar8 & 0xff,opts);
        iVar21 = ly_print(out,(char *)local_48);
        iVar21 = iVar21 + iVar8;
        lydict_remove(opts->module->ctx,(char *)local_48);
      }
    }
    else {
      if (LVar17 == LYS_ANYXML) {
        if (max_name_len == 0) {
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x26a,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        iVar8 = tree_print_wrap(out,iVar9,iVar21,(cVar5 - cVar6) + '\x03',6,opts);
        pcVar19 = "anyxml";
      }
      else {
        if (LVar17 != LYS_ANYDATA) goto LAB_0019639c;
        if (max_name_len == 0) {
          __assert_fail("max_name_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
                        ,0x264,
                        "void tree_print_snode(struct lyout *, int, uint16_t, const struct lys_node *, int, const struct lys_node *, int, tp_opts *)"
                       );
        }
        iVar8 = tree_print_wrap(out,iVar9,iVar21,(cVar5 - cVar6) + '\x03',7,opts);
        pcVar19 = "anydata";
      }
      iVar21 = ly_print(out,pcVar19);
      iVar21 = iVar21 + iVar8;
    }
LAB_0019639c:
    iVar8 = (int)text_str;
    level = (int)text_str;
    if ((opts->options & 1) == 0) {
      LVar17 = node->nodetype & mask;
      if (LVar17 == LYS_CHOICE) {
        pplVar22 = (lys_module **)node[1].name;
        mask = local_34;
        if (pplVar22 != (lys_module **)0x0) {
          plVar11 = *pplVar22;
          goto LAB_001963ea;
        }
      }
      else if ((LVar17 == LYS_LEAF) &&
              (plVar11 = (lys_module *)node[1].prev, local_48 = plVar11,
              plVar11 != (lys_module *)0x0)) {
        pplVar22 = &local_48;
LAB_001963ea:
        sVar15 = strlen((char *)plVar11);
        iVar8 = tree_print_wrap(out,iVar8,iVar21,'\x01',(short)sVar15 + 2,opts);
        iVar21 = ly_print(out,"<%s>",*pplVar22);
        iVar21 = iVar21 + iVar8;
        mask = local_34;
        level = (int)text_str;
      }
    }
    LVar17 = node->nodetype & mask;
    if ((int)LVar17 < 0x80) {
      if ((LVar17 - LYS_CONTAINER < 0x40) &&
         ((0x800000008000808bU >> ((ulong)(LVar17 - LYS_CONTAINER) & 0x3f) & 1) != 0))
      goto LAB_0019645e;
    }
    else if ((int)LVar17 < 0x1000) {
      if ((LVar17 == LYS_NOTIF) || (LVar17 == LYS_RPC)) goto LAB_0019645e;
    }
    else if ((LVar17 == LYS_USES) || ((LVar17 == LYS_ANYDATA || (LVar17 == LYS_ACTION)))) {
LAB_0019645e:
      plVar10 = node->parent;
      if ((plVar10 == (lys_node *)0x0) || (plVar10->nodetype != LYS_AUGMENT)) {
        iff1 = node->iffeature;
        iff1_size = node->iffeature_size;
        iff2 = (lys_iffeature *)0x0;
        iff2_size = '\0';
      }
      else {
        iff1 = node->iffeature;
        iff1_size = node->iffeature_size;
        iff2 = plVar10->iffeature;
        iff2_size = plVar10->iffeature_size;
      }
      iVar8 = tree_print_features(out,iff1,iff1_size,iff2,iff2_size,opts,(char **)&local_48);
      if ((char)iVar8 != '\0') {
        tree_print_wrap(out,level,iVar21,'\x01',(ushort)iVar8 & 0xff,opts);
        ly_print(out,(char *)local_48);
        lydict_remove(opts->module->ctx,(char *)local_48);
      }
    }
    ly_print(out,"\n");
    if (subtree == 1) {
      return;
    }
    LVar17 = node->nodetype;
    LVar7 = LVar17 & mask;
    if ((int)LVar7 < 0x400) {
      if (LVar7 == LYS_NOTIF) {
LAB_00196574:
        iVar8 = 2;
      }
      else {
        iVar8 = 1;
        if (LVar7 != LYS_INPUT) goto LAB_0019657d;
      }
      opts->spec_config = iVar8;
    }
    else {
      if (LVar7 == LYS_USES) {
        return;
      }
      if (LVar7 == LYS_OUTPUT) goto LAB_00196574;
    }
  }
  else if ((LVar7 != LYS_GROUPING) && ((LVar7 != LYS_USES || ((opts->options & 4) != 0))))
  goto LAB_00195beb;
LAB_0019657d:
  LVar17 = LVar17 & mask;
  text_str = (char *)node;
  if ((int)LVar17 < 0x100) {
    if (0xf < (int)LVar17) {
      if ((int)LVar17 < 0x40) {
        if (LVar17 == LYS_LIST) goto switchD_001965b0_caseD_1;
        if (LVar17 == LYS_ANYXML) goto switchD_001965b0_caseD_4;
      }
      else if ((LVar17 == LYS_CASE) || (LVar17 == LYS_NOTIF)) {
LAB_001966a1:
        plVar10 = node->child;
        iVar8 = 0x903f;
        iVar9 = 0x903f;
        goto LAB_001966b5;
      }
switchD_001965b0_caseD_3:
      ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_tree.c"
             ,0x2f2);
      goto switchD_001965b0_caseD_4;
    }
    switch(LVar17) {
    case LYS_CONTAINER:
switchD_001965b0_caseD_1:
      plVar10 = node->child;
      iVar8 = 0xd0bf;
      iVar9 = 0xd0bf;
      break;
    case LYS_CHOICE:
      plVar10 = node->child;
      iVar8 = 0x807d;
      iVar9 = 0x807d;
      break;
    default:
      goto switchD_001965b0_caseD_3;
    case LYS_LEAF:
    case LYS_LEAFLIST:
      goto switchD_001965b0_caseD_4;
    }
LAB_001966b5:
    max_name_len_00 = tree_get_max_name_len(plVar10,(lys_node *)0x0,iVar9,opts);
  }
  else {
    iVar8 = 0x600;
    max_name_len_00 = 0;
    if (0x7ff < (int)LVar17) {
      if ((int)LVar17 < 0x4000) {
        if (LVar17 == LYS_GROUPING) goto switchD_001965b0_caseD_1;
        if (LVar17 == LYS_USES) {
          iVar8 = 0xd0bf;
          max_name_len_00 = max_name_len;
          goto LAB_001966c1;
        }
      }
      else {
        if (LVar17 == LYS_ACTION) goto LAB_001966c1;
        if (LVar17 == LYS_ANYDATA) goto switchD_001965b0_caseD_4;
      }
      goto switchD_001965b0_caseD_3;
    }
    if (LVar17 != LYS_RPC) {
      if ((LVar17 == LYS_INPUT) || (LVar17 == LYS_OUTPUT)) goto LAB_001966a1;
      goto switchD_001965b0_caseD_3;
    }
  }
LAB_001966c1:
  for (plVar10 = *(lys_node **)(text_str + 0x48); plVar10 != (lys_node *)0x0;
      plVar10 = plVar10->next) {
    if ((((opts->module->field_0x40 & 1) == 0) || (plVar10->parent == (lys_node *)text_str)) ||
       (plVar10->module == opts->module)) {
      tree_print_snode(out,level,max_name_len_00,plVar10,iVar8,(lys_node *)0x0,0,opts);
    }
  }
switchD_001965b0_caseD_4:
  local_34 = local_34 & *(LYS_NODE *)(text_str + 0x38);
  if (((local_34 == LYS_NOTIF) || (local_34 == LYS_OUTPUT)) || (local_34 == LYS_INPUT)) {
    opts->spec_config = 0;
  }
  return;
}

Assistant:

static void
tree_print_snode(struct lyout *out, int level, uint16_t max_name_len, const struct lys_node *node, int mask,
                 const struct lys_node *aug_parent, int subtree, tp_opts *opts)
{
    struct lys_node *sub;
    int line_len, node_len, child_mask;
    uint8_t text_len, text_indent;
    uint16_t max_child_len;
    const char *text_str;

    /* disabled/not printed node */
    if (lys_is_disabled(node, (node->parent && node->parent->nodetype == LYS_AUGMENT) ? 1 : 0) || !(node->nodetype & mask)) {
        return;
    }

    /* implicit input/output/case */
    if (((node->nodetype & mask) & (LYS_INPUT | LYS_OUTPUT | LYS_CASE)) && (node->flags & LYS_IMPLICIT)) {
        if ((node->nodetype != LYS_CASE) || lys_is_disabled(node->child, 0)) {
            return;
        }
    }

    /* special uses and grouping handling */
    switch (node->nodetype & mask) {
    case LYS_USES:
        if (opts->options & LYS_OUTOPT_TREE_USES) {
            break;
        }
        /* fallthrough */
    case LYS_GROUPING:
        goto print_children;
    case LYS_ANYXML:
        if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
            /* node added by libyang, not actually in the model */
            return;
        }
        break;
    default:
        break;
    }

    /* print indent */
    line_len = tree_print_indent(out, level, opts);
    /* print status */
    line_len += ly_print(out, "%s--", (node->flags & LYS_STATUS_DEPRC ? "x" : (node->flags & LYS_STATUS_OBSLT ? "o" : "+")));
    /* print config flags (or special opening for case, choice) */
    line_len += tree_print_config(out, node, opts->spec_config);
    /* print optionally prefix */
    node_len = tree_print_prefix(out, node, opts);
    /* print name */
    node_len += ly_print(out, node->name);

    /* print one-character opts */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
        if (!(node->flags & LYS_MAND_TRUE) && !tree_leaf_is_mandatory(node)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->presence) {
            node_len += ly_print(out, "!");
        }
        break;
    case LYS_LIST:
    case LYS_LEAFLIST:
        node_len += ly_print(out, "*");
        break;
    case LYS_CASE:
        /* kinda shady, but consistent in a way */
        node_len += ly_print(out, ")");
        break;
    case LYS_CHOICE:
        node_len += ly_print(out, ")");
        if (!(node->flags & LYS_MAND_TRUE)) {
            node_len += ly_print(out, "?");
        }
        break;
    default:
        break;
    }
    line_len += node_len;

    /**
     * wrapped print
     */

    /* learn next level indent (there is never a sibling for subtree) */
    ++level;
    if (!subtree) {
        tree_next_indent(level, node, aug_parent, opts);
    }

    /* print type/keys */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        text_len = tree_print_type(out, &((struct lys_node_leaf *)node)->type, opts->options, &text_str);
        line_len = tree_print_wrap(out, level, line_len, text_indent, text_len, opts);
        line_len += ly_print(out, text_str);
        lydict_remove(opts->module->ctx, text_str);
        break;
    case LYS_ANYDATA:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 7, opts);
        line_len += ly_print(out, "anydata");
        break;
    case LYS_ANYXML:
        assert(max_name_len);
        text_indent = LY_TREE_TYPE_INDENT + (uint8_t)(max_name_len - node_len);
        line_len = tree_print_wrap(out, level, line_len, text_indent, 6, opts);
        line_len += ly_print(out, "anyxml");
        break;
    case LYS_LIST:
        text_len = tree_print_keys(out, ((struct lys_node_list *)node)->keys, ((struct lys_node_list *)node)->keys_size,
                                   opts, &text_str);
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        break;
    }

    /* print default */
    if (!(opts->options & LYS_OUTOPT_TREE_RFC)) {
        switch (node->nodetype & mask) {
        case LYS_LEAF:
            text_str = ((struct lys_node_leaf *)node)->dflt;
            if (text_str) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(text_str), opts);
                line_len += ly_print(out, "<%s>", text_str);
            }
            break;
        case LYS_CHOICE:
            sub = ((struct lys_node_choice *)node)->dflt;
            if (sub) {
                line_len = tree_print_wrap(out, level, line_len, 1, 2 + strlen(sub->name), opts);
                line_len += ly_print(out, "<%s>", sub->name);
            }
            break;
        default:
            break;
        }
    }

    /* print if-features */
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_CASE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
    case LYS_USES:
        if (node->parent && (node->parent->nodetype == LYS_AUGMENT)) {
            /* if-features from an augment are de facto inherited */
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size,
                                           node->parent->iffeature, node->parent->iffeature_size, opts, &text_str);
        } else {
            text_len = tree_print_features(out, node->iffeature, node->iffeature_size, NULL, 0, opts, &text_str);
        }
        if (text_len) {
            line_len = tree_print_wrap(out, level, line_len, 1, text_len, opts);
            line_len += ly_print(out, text_str);
            lydict_remove(opts->module->ctx, text_str);
        }
        break;
    default:
        /* only grouping */
        break;
    }

    /* this node is finished printing */
    ly_print(out, "\n");

    if ((subtree == 1) || ((node->nodetype & mask) == LYS_USES)) {
        /* we are printing subtree parents, finish here (or uses option) */
        return;
    }

    /* set special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
        opts->spec_config = 1;
        break;
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 2;
        break;
    default:
        break;
    }

print_children:
    /* set child mask and learn the longest child name (needed only if a child can have type) */
    switch (node->nodetype & mask) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        child_mask = 0;
        max_child_len = 0;
        break;
    case LYS_RPC:
    case LYS_ACTION:
        child_mask = LYS_INPUT | LYS_OUTPUT;
        max_child_len = 0;
        break;
    case LYS_CHOICE:
        child_mask = LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_CASE:
    case LYS_NOTIF:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    case LYS_USES:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        /* inherit the name length from the parent, it does not change */
        max_child_len = max_name_len;
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
        child_mask = LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_USES | LYS_ACTION | LYS_NOTIF;
        max_child_len = tree_get_max_name_len(node->child, NULL, child_mask, opts);
        break;
    default:
        child_mask = 0;
        max_child_len = 0;
        LOGINT(node->module->ctx);
        break;
    }

    /* print descendants (children) */
    if (child_mask) {
        LY_TREE_FOR(node->child, sub) {
            /* submodule, foreign augments */
            if (opts->module->type && (sub->parent != node) && (sub->module != opts->module)) {
                continue;
            }
            tree_print_snode(out, level, max_child_len, sub, child_mask, NULL, 0, opts);
        }
    }

    /* reset special config flag */
    switch (node->nodetype & mask) {
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        opts->spec_config = 0;
        break;
    default:
        break;
    }
}